

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,Status *status)

{
  string local_30;
  
  util::Status::ToString_abi_cxx11_(&local_30,status);
  std::__cxx11::string::append((string *)&this->message_);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

LogMessage& LogMessage::operator<<(const util::Status& status) {
  message_ += status.ToString();
  return *this;
}